

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

acttab * acttab_alloc(int nsymbol,int nterminal)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  acttab *paVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  undefined4 extraout_EDX;
  int iVar13;
  int iVar14;
  long lVar15;
  uint *__ptr;
  uint *__ptr_00;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t __size;
  
  lVar15 = 1;
  iVar7 = 0x38;
  paVar9 = (acttab *)calloc(1,0x38);
  if (paVar9 != (acttab *)0x0) {
    paVar9->mxLookahead = 0;
    paVar9->nLookahead = 0;
    paVar9->nLookaheadAlloc = 0;
    paVar9->nterminal = 0;
    paVar9->aLookahead = (lookahead_action *)0x0;
    paVar9->mnLookahead = 0;
    paVar9->mnAction = 0;
    paVar9->nAction = 0;
    paVar9->nActionAlloc = 0;
    paVar9->aAction = (lookahead_action *)0x0;
    *(undefined8 *)&paVar9->nsymbol = 0;
    paVar9->nsymbol = nsymbol;
    paVar9->nterminal = nterminal;
    return paVar9;
  }
  acttab_alloc_cold_1();
  iVar14 = *(int *)(lVar15 + 0x28);
  if (iVar14 <= *(int *)(lVar15 + 0x24)) {
    *(int *)(lVar15 + 0x28) = iVar14 + 0x19;
    __ptr = *(uint **)(lVar15 + 0x10);
    __size = (long)iVar14 * 8 + 200;
    pvVar10 = realloc(__ptr,__size);
    iVar14 = (int)__size;
    *(void **)(lVar15 + 0x10) = pvVar10;
    if (pvVar10 == (void *)0x0) {
      acttab_action_cold_1();
      iVar7 = *__ptr + __ptr[0xc] + 1;
      uVar6 = __ptr[1];
      if ((int)uVar6 <= iVar7) {
        uVar8 = iVar7 + uVar6 + 0x14;
        __ptr[1] = uVar8;
        __ptr_00 = *(uint **)(__ptr + 2);
        pvVar10 = realloc(__ptr_00,(long)(int)uVar8 << 3);
        *(void **)(__ptr + 2) = pvVar10;
        if (pvVar10 == (void *)0x0) {
          acttab_insert_cold_1();
          paVar9 = (acttab *)(ulong)*__ptr_00;
          if (0 < (int)*__ptr_00) {
            do {
              iVar7 = (int)paVar9;
              if (-1 < *(int *)(*(long *)(__ptr_00 + 2) + -8 + (long)paVar9 * 8)) {
                return paVar9;
              }
              paVar9 = (acttab *)(ulong)(iVar7 - 1);
            } while (1 < iVar7);
            paVar9 = (acttab *)0x0;
          }
          return paVar9;
        }
        if ((int)uVar6 < (int)__ptr[1]) {
          memset((void *)((long)pvVar10 + (long)(int)uVar6 * 8),0xff,
                 (ulong)(__ptr[1] + ~uVar6) * 8 + 8);
        }
      }
      if (iVar14 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = __ptr[6];
      }
      uVar8 = *__ptr;
      bVar4 = (int)uVar6 < (int)uVar8;
      if ((int)uVar6 < (int)uVar8) {
        lVar15 = *(long *)(__ptr + 2);
        uVar1 = __ptr[6];
        iVar7 = uVar1 - uVar8;
        uVar16 = (long)(int)uVar8;
        do {
          iVar7 = iVar7 + 1;
          uVar12 = uVar16 - 1;
          if ((*(uint *)(lVar15 + -8 + uVar16 * 8) == uVar1) &&
             (*(uint *)(lVar15 + 4 + uVar12 * 8) == __ptr[7])) {
            uVar16 = (ulong)(int)__ptr[9];
            bVar5 = 0 < (long)uVar16;
            if (0 < (long)uVar16) {
              piVar3 = *(int **)(__ptr + 4);
              iVar13 = *piVar3;
              uVar17 = (iVar13 - uVar1) + (int)uVar12;
              if ((int)uVar17 < (int)uVar8 && -1 < (int)uVar17) {
                uVar19 = 1;
                while ((iVar13 == *(int *)(lVar15 + (ulong)uVar17 * 8) &&
                       (piVar3[uVar19 * 2 + -1] == *(int *)(lVar15 + 4 + (ulong)uVar17 * 8)))) {
                  if (uVar16 == uVar19) goto LAB_00102cf4;
                  bVar5 = uVar19 < uVar16;
                  iVar13 = piVar3[uVar19 * 2];
                  uVar17 = (iVar13 - uVar1) + (int)uVar12;
                  if (((int)uVar17 < 0) || (uVar19 = uVar19 + 1, (int)uVar8 <= (int)uVar17)) break;
                }
              }
              if (bVar5) goto LAB_00102d33;
            }
LAB_00102cf4:
            if ((int)uVar8 < 1) {
              uVar17 = 0;
            }
            else {
              uVar16 = 0;
              uVar17 = 0;
              do {
                iVar13 = *(int *)(lVar15 + uVar16 * 8);
                uVar17 = uVar17 + (iVar7 + (int)uVar16 == iVar13 && -1 < iVar13);
                uVar16 = uVar16 + 1;
              } while (uVar8 != uVar16);
            }
            if (uVar17 == __ptr[9]) {
              if (bVar4) goto LAB_00102e0c;
              break;
            }
          }
LAB_00102d33:
          bVar4 = (long)(int)uVar6 < (long)uVar12;
          uVar16 = uVar12;
        } while ((long)(int)uVar6 < (long)uVar12);
      }
      if (iVar14 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)__ptr[6];
      }
      uVar16 = (long)(int)__ptr[1] - (long)(int)__ptr[8];
      iVar7 = (int)uVar12;
      if (iVar7 < (int)uVar16) {
        lVar15 = *(long *)(__ptr + 2);
        uVar12 = (ulong)iVar7;
        iVar7 = -iVar7;
        do {
          if (*(int *)(lVar15 + uVar12 * 8) < 0) {
            uVar19 = (ulong)(int)__ptr[9];
            bVar4 = 0 < (long)uVar19;
            if (0 < (long)uVar19) {
              uVar6 = (**(int **)(__ptr + 4) - __ptr[6]) + (int)uVar12;
              if (-1 < (int)uVar6) {
                uVar18 = 1;
                do {
                  if (-1 < *(int *)(lVar15 + (ulong)uVar6 * 8)) break;
                  if (uVar19 == uVar18) goto LAB_00102dc0;
                  bVar4 = uVar18 < uVar19;
                  lVar11 = uVar18 * 2;
                  uVar18 = uVar18 + 1;
                  uVar6 = ((*(int **)(__ptr + 4))[lVar11] - __ptr[6]) + (int)uVar12;
                } while (-1 < (int)uVar6);
              }
              if (bVar4) goto LAB_00102ded;
            }
LAB_00102dc0:
            if ((int)uVar8 < 1) {
              uVar19 = 0;
            }
            else {
              uVar19 = 0;
              do {
                if (__ptr[6] + iVar7 + (int)uVar19 == *(int *)(lVar15 + uVar19 * 8))
                goto LAB_00102de8;
                uVar19 = uVar19 + 1;
              } while (uVar8 != uVar19);
              uVar19 = (ulong)uVar8;
            }
LAB_00102de8:
            if ((uint)uVar19 == uVar8) {
              uVar12 = uVar12 & 0xffffffff;
              goto LAB_00102e0c;
            }
          }
LAB_00102ded:
          uVar12 = uVar12 + 1;
          iVar7 = iVar7 + -1;
        } while ((long)uVar12 < (long)uVar16);
        uVar12 = uVar16 & 0xffffffff;
      }
LAB_00102e0c:
      iVar7 = (int)uVar12;
      if (0 < (int)__ptr[9]) {
        lVar15 = 0;
        do {
          iVar13 = (*(int *)(*(long *)(__ptr + 4) + lVar15 * 8) - __ptr[6]) + iVar7;
          *(undefined8 *)(*(long *)(__ptr + 2) + (long)iVar13 * 8) =
               *(undefined8 *)(*(long *)(__ptr + 4) + lVar15 * 8);
          if ((int)*__ptr <= iVar13) {
            *__ptr = iVar13 + 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)__ptr[9]);
      }
      if ((iVar14 != 0) && ((int)*__ptr <= (int)(__ptr[0xb] + iVar7))) {
        *__ptr = __ptr[0xb] + iVar7 + 1;
      }
      __ptr[9] = 0;
      return (acttab *)(ulong)(iVar7 - __ptr[6]);
    }
  }
  iVar14 = *(int *)(lVar15 + 0x24);
  lVar11 = (long)iVar14;
  if (lVar11 == 0) {
    *(int *)(lVar15 + 0x20) = iVar7;
  }
  else {
    if (*(int *)(lVar15 + 0x20) < iVar7) {
      *(int *)(lVar15 + 0x20) = iVar7;
    }
    if (*(int *)(lVar15 + 0x18) <= iVar7) goto LAB_00102baa;
  }
  *(int *)(lVar15 + 0x18) = iVar7;
  *(undefined4 *)(lVar15 + 0x1c) = extraout_EDX;
LAB_00102baa:
  lVar2 = *(long *)(lVar15 + 0x10);
  *(int *)(lVar2 + lVar11 * 8) = iVar7;
  *(undefined4 *)(lVar2 + 4 + lVar11 * 8) = extraout_EDX;
  uVar6 = iVar14 + 1;
  *(uint *)(lVar15 + 0x24) = uVar6;
  return (acttab *)(ulong)uVar6;
}

Assistant:

acttab *acttab_alloc(int nsymbol, int nterminal){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  p->nsymbol = nsymbol;
  p->nterminal = nterminal;
  return p;
}